

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-reader.h
# Opt level: O2

Reference __thiscall
mp::internal::
NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
::DoReadReference(NLReader<mp::internal::BinaryReader<mp::internal::IdentityConverter>,_mp::internal::NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>_>
                  *this)

{
  int iVar1;
  int var_index;
  Reference RVar2;
  
  var_index = ReadUInt(this,this->num_vars_and_exprs_);
  iVar1 = (this->header_->super_NLProblemInfo).super_NLProblemInfo_C.num_vars;
  if (var_index < iVar1) {
    RVar2 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnVariableRef
                      (this->handler_,var_index);
    return (Reference)
           RVar2.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_;
  }
  RVar2 = NLProblemBuilder<mp::BasicProblem<mp::BasicProblemParams<int>_>_>::OnCommonExprRef
                    (this->handler_,var_index - iVar1);
  return (Reference)RVar2.super_BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3>.super_ExprBase.impl_
  ;
}

Assistant:

Reference DoReadReference() {
    int index = ReadUInt(num_vars_and_exprs_);
    reader_.ReadTillEndOfLine();
    return index < header_.num_vars ?
          handler_.OnVariableRef(index) :
          handler_.OnCommonExprRef(index - header_.num_vars);
  }